

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

PaError PaUtil_InitializeBufferProcessor
                  (PaUtilBufferProcessor *bp,int inputChannelCount,
                  PaSampleFormat userInputSampleFormat,PaSampleFormat hostInputSampleFormat,
                  int outputChannelCount,PaSampleFormat userOutputSampleFormat,
                  PaSampleFormat hostOutputSampleFormat,double sampleRate,PaStreamFlags streamFlags,
                  unsigned_long framesPerUserBuffer,unsigned_long framesPerHostBuffer,
                  PaUtilHostBufferSizeMode hostBufferSizeMode,PaStreamCallback *streamCallback,
                  void *userData)

{
  unsigned_long uVar1;
  PaUtilConverter *pPVar2;
  PaUtilZeroer *pPVar3;
  size_t sVar4;
  void *pvVar5;
  void **ppvVar6;
  PaUtilChannelDescriptor *pPVar7;
  unsigned_long frameShift;
  PaStreamFlags tempInputStreamFlags;
  unsigned_long tempOutputBufferSize;
  unsigned_long tempInputBufferSize;
  PaError bytesPerSample;
  PaError result;
  double sampleRate_local;
  PaSampleFormat userOutputSampleFormat_local;
  int outputChannelCount_local;
  PaSampleFormat hostInputSampleFormat_local;
  PaSampleFormat userInputSampleFormat_local;
  int inputChannelCount_local;
  PaUtilBufferProcessor *bp_local;
  
  if (((streamFlags & 4) != 0) &&
     ((((streamCallback == (PaStreamCallback *)0x0 || (inputChannelCount < 1)) ||
       (outputChannelCount < 1)) || (framesPerUserBuffer != 0)))) {
    return -0x270b;
  }
  bp->tempInputBuffer = (void *)0x0;
  bp->tempInputBufferPtrs = (void **)0x0;
  bp->tempOutputBuffer = (void *)0x0;
  bp->tempOutputBufferPtrs = (void **)0x0;
  bp->framesPerUserBuffer = framesPerUserBuffer;
  bp->framesPerHostBuffer = framesPerHostBuffer;
  bp->inputChannelCount = inputChannelCount;
  bp->outputChannelCount = outputChannelCount;
  bp->hostBufferSizeMode = hostBufferSizeMode;
  bp->hostInputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  bp->hostInputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  if (framesPerUserBuffer == 0) {
    bp->useNonAdaptingProcess = 1;
    bp->initialFramesInTempInputBuffer = 0;
    bp->initialFramesInTempOutputBuffer = 0;
    if ((hostBufferSizeMode == paUtilFixedHostBufferSize) ||
       (hostBufferSizeMode == paUtilBoundedHostBufferSize)) {
      bp->framesPerTempBuffer = framesPerHostBuffer;
    }
    else {
      bp->framesPerTempBuffer = 0x400;
    }
  }
  else {
    bp->framesPerTempBuffer = framesPerUserBuffer;
    if ((hostBufferSizeMode == paUtilFixedHostBufferSize) &&
       (framesPerHostBuffer % framesPerUserBuffer == 0)) {
      bp->useNonAdaptingProcess = 1;
      bp->initialFramesInTempInputBuffer = 0;
      bp->initialFramesInTempOutputBuffer = 0;
    }
    else {
      bp->useNonAdaptingProcess = 0;
      if ((inputChannelCount < 1) || (outputChannelCount < 1)) {
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = 0;
      }
      else if (hostBufferSizeMode == paUtilFixedHostBufferSize) {
        uVar1 = CalculateFrameShift(framesPerHostBuffer,framesPerUserBuffer);
        if (framesPerHostBuffer < framesPerUserBuffer) {
          bp->initialFramesInTempInputBuffer = uVar1;
          bp->initialFramesInTempOutputBuffer = 0;
        }
        else {
          bp->initialFramesInTempInputBuffer = 0;
          bp->initialFramesInTempOutputBuffer = uVar1;
        }
      }
      else {
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
      }
    }
  }
  bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
  bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;
  if (0 < inputChannelCount) {
    tempInputBufferSize._4_4_ = Pa_GetSampleSize(hostInputSampleFormat);
    if ((int)tempInputBufferSize._4_4_ < 1) goto LAB_00118ba9;
    bp->bytesPerHostInputSample = tempInputBufferSize._4_4_;
    tempInputBufferSize._4_4_ = Pa_GetSampleSize(userInputSampleFormat);
    if ((int)tempInputBufferSize._4_4_ < 1) goto LAB_00118ba9;
    bp->bytesPerUserInputSample = tempInputBufferSize._4_4_;
    frameShift = streamFlags;
    if ((((streamFlags & 2) == 0) && ((hostInputSampleFormat & 2) != 0)) &&
       ((userInputSampleFormat & 4) != 0)) {
      frameShift = streamFlags | 2;
    }
    pPVar2 = PaUtil_SelectConverter(hostInputSampleFormat,userInputSampleFormat,frameShift);
    bp->inputConverter = pPVar2;
    pPVar3 = PaUtil_SelectZeroer(userInputSampleFormat);
    bp->inputZeroer = pPVar3;
    bp->userInputIsInterleaved = (uint)((userInputSampleFormat & 0x80000000) == 0);
    bp->hostInputIsInterleaved = (uint)((hostInputSampleFormat & 0x80000000) == 0);
    bp->userInputSampleFormatIsEqualToHost =
         (uint)((userInputSampleFormat & 0xffffffff7fffffff) ==
               (hostInputSampleFormat & 0xffffffff7fffffff));
    sVar4 = bp->framesPerTempBuffer * (ulong)bp->bytesPerUserInputSample * (long)inputChannelCount;
    pvVar5 = PaUtil_AllocateMemory(sVar4);
    bp->tempInputBuffer = pvVar5;
    if (bp->tempInputBuffer == (void *)0x0) {
      tempInputBufferSize._4_4_ = 0xffffd8f8;
      goto LAB_00118ba9;
    }
    if (bp->framesInTempInputBuffer != 0) {
      memset(bp->tempInputBuffer,0,sVar4);
    }
    if ((userInputSampleFormat & 0x80000000) != 0) {
      ppvVar6 = (void **)PaUtil_AllocateMemory((long)inputChannelCount << 3);
      bp->tempInputBufferPtrs = ppvVar6;
      if (bp->tempInputBufferPtrs == (void **)0x0) {
        tempInputBufferSize._4_4_ = 0xffffd8f8;
        goto LAB_00118ba9;
      }
    }
    pPVar7 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory((long)inputChannelCount << 5);
    bp->hostInputChannels[0] = pPVar7;
    if (bp->hostInputChannels[0] == (PaUtilChannelDescriptor *)0x0) {
      tempInputBufferSize._4_4_ = 0xffffd8f8;
      goto LAB_00118ba9;
    }
    bp->hostInputChannels[1] = bp->hostInputChannels[0] + inputChannelCount;
  }
  if (outputChannelCount < 1) {
LAB_00118b57:
    PaUtil_InitializeTriangularDitherState(&bp->ditherGenerator);
    bp->samplePeriod = 1.0 / sampleRate;
    bp->streamCallback = streamCallback;
    bp->userData = userData;
    return 0;
  }
  tempInputBufferSize._4_4_ = Pa_GetSampleSize(hostOutputSampleFormat);
  if (0 < (int)tempInputBufferSize._4_4_) {
    bp->bytesPerHostOutputSample = tempInputBufferSize._4_4_;
    tempInputBufferSize._4_4_ = Pa_GetSampleSize(userOutputSampleFormat);
    if (0 < (int)tempInputBufferSize._4_4_) {
      bp->bytesPerUserOutputSample = tempInputBufferSize._4_4_;
      pPVar2 = PaUtil_SelectConverter(userOutputSampleFormat,hostOutputSampleFormat,streamFlags);
      bp->outputConverter = pPVar2;
      pPVar3 = PaUtil_SelectZeroer(hostOutputSampleFormat);
      bp->outputZeroer = pPVar3;
      bp->userOutputIsInterleaved = (uint)((userOutputSampleFormat & 0x80000000) == 0);
      bp->hostOutputIsInterleaved = (uint)((hostOutputSampleFormat & 0x80000000) == 0);
      bp->userOutputSampleFormatIsEqualToHost =
           (uint)((userOutputSampleFormat & 0xffffffff7fffffff) ==
                 (hostOutputSampleFormat & 0xffffffff7fffffff));
      sVar4 = bp->framesPerTempBuffer * (ulong)bp->bytesPerUserOutputSample *
              (long)outputChannelCount;
      pvVar5 = PaUtil_AllocateMemory(sVar4);
      bp->tempOutputBuffer = pvVar5;
      if (bp->tempOutputBuffer == (void *)0x0) {
        tempInputBufferSize._4_4_ = 0xffffd8f8;
      }
      else {
        if (bp->framesInTempOutputBuffer != 0) {
          memset(bp->tempOutputBuffer,0,sVar4);
        }
        if ((userOutputSampleFormat & 0x80000000) != 0) {
          ppvVar6 = (void **)PaUtil_AllocateMemory((long)outputChannelCount << 3);
          bp->tempOutputBufferPtrs = ppvVar6;
          if (bp->tempOutputBufferPtrs == (void **)0x0) {
            tempInputBufferSize._4_4_ = 0xffffd8f8;
            goto LAB_00118ba9;
          }
        }
        pPVar7 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory((long)outputChannelCount << 5);
        bp->hostOutputChannels[0] = pPVar7;
        if (bp->hostOutputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
          bp->hostOutputChannels[1] = bp->hostOutputChannels[0] + outputChannelCount;
          goto LAB_00118b57;
        }
        tempInputBufferSize._4_4_ = 0xffffd8f8;
      }
    }
  }
LAB_00118ba9:
  if (bp->tempInputBuffer != (void *)0x0) {
    PaUtil_FreeMemory(bp->tempInputBuffer);
  }
  if (bp->tempInputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory(bp->tempInputBufferPtrs);
  }
  if (bp->hostInputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory(bp->hostInputChannels[0]);
  }
  if (bp->tempOutputBuffer != (void *)0x0) {
    PaUtil_FreeMemory(bp->tempOutputBuffer);
  }
  if (bp->tempOutputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory(bp->tempOutputBufferPtrs);
  }
  if (bp->hostOutputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory(bp->hostOutputChannels[0]);
  }
  return tempInputBufferSize._4_4_;
}

Assistant:

PaError PaUtil_InitializeBufferProcessor( PaUtilBufferProcessor* bp,
        int inputChannelCount, PaSampleFormat userInputSampleFormat,
        PaSampleFormat hostInputSampleFormat,
        int outputChannelCount, PaSampleFormat userOutputSampleFormat,
        PaSampleFormat hostOutputSampleFormat,
        double sampleRate,
        PaStreamFlags streamFlags,
        unsigned long framesPerUserBuffer,
        unsigned long framesPerHostBuffer,
        PaUtilHostBufferSizeMode hostBufferSizeMode,
        PaStreamCallback *streamCallback, void *userData )
{
    PaError result = paNoError;
    PaError bytesPerSample;
    unsigned long tempInputBufferSize, tempOutputBufferSize;
    PaStreamFlags tempInputStreamFlags;

    if( streamFlags & paNeverDropInput )
    {
        /* paNeverDropInput is only valid for full-duplex callback streams, with an unspecified number of frames per buffer. */
        if( !streamCallback || !(inputChannelCount > 0 && outputChannelCount > 0) ||
                framesPerUserBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    /* initialize buffer ptrs to zero so they can be freed if necessary in error */
    bp->tempInputBuffer = 0;
    bp->tempInputBufferPtrs = 0;
    bp->tempOutputBuffer = 0;
    bp->tempOutputBufferPtrs = 0;

    bp->framesPerUserBuffer = framesPerUserBuffer;
    bp->framesPerHostBuffer = framesPerHostBuffer;

    bp->inputChannelCount = inputChannelCount;
    bp->outputChannelCount = outputChannelCount;

    bp->hostBufferSizeMode = hostBufferSizeMode;

    bp->hostInputChannels[0] = bp->hostInputChannels[1] = 0;
    bp->hostOutputChannels[0] = bp->hostOutputChannels[1] = 0;

    if( framesPerUserBuffer == 0 ) /* streamCallback will accept any buffer size */
    {
        bp->useNonAdaptingProcess = 1;
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = 0;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                || hostBufferSizeMode == paUtilBoundedHostBufferSize )
        {
            bp->framesPerTempBuffer = framesPerHostBuffer;
        }
        else /* unknown host buffer size */
        {
             bp->framesPerTempBuffer = PA_FRAMES_PER_TEMP_BUFFER_WHEN_HOST_BUFFER_SIZE_IS_UNKNOWN_;
        }
    }
    else
    {
        bp->framesPerTempBuffer = framesPerUserBuffer;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                && framesPerHostBuffer % framesPerUserBuffer == 0 )
        {
            bp->useNonAdaptingProcess = 1;
            bp->initialFramesInTempInputBuffer = 0;
            bp->initialFramesInTempOutputBuffer = 0;
        }
        else
        {
            bp->useNonAdaptingProcess = 0;

            if( inputChannelCount > 0 && outputChannelCount > 0 )
            {
                /* full duplex */
                if( hostBufferSizeMode == paUtilFixedHostBufferSize )
                {
                    unsigned long frameShift =
                        CalculateFrameShift( framesPerHostBuffer, framesPerUserBuffer );

                    if( framesPerUserBuffer > framesPerHostBuffer )
                    {
                        bp->initialFramesInTempInputBuffer = frameShift;
                        bp->initialFramesInTempOutputBuffer = 0;
                    }
                    else
                    {
                        bp->initialFramesInTempInputBuffer = 0;
                        bp->initialFramesInTempOutputBuffer = frameShift;
                    }
                }
                else /* variable host buffer size, add framesPerUserBuffer latency */
                {
                    bp->initialFramesInTempInputBuffer = 0;
                    bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
                }
            }
            else
            {
                /* half duplex */
                bp->initialFramesInTempInputBuffer = 0;
                bp->initialFramesInTempOutputBuffer = 0;
            }
        }
    }


    bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
    bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;

    
    if( inputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        /* Under the assumption that no ADC in existence delivers better than 24bits resolution,
            we disable dithering when host input format is paInt32 and user format is paInt24, 
            since the host samples will just be padded with zeros anyway. */

        tempInputStreamFlags = streamFlags;
        if( !(tempInputStreamFlags & paDitherOff) /* dither is on */
                && (hostInputSampleFormat & paInt32) /* host input format is int32 */
                && (userInputSampleFormat & paInt24) /* user requested format is int24 */ ){

            tempInputStreamFlags = tempInputStreamFlags | paDitherOff;
        }

        bp->inputConverter =
            PaUtil_SelectConverter( hostInputSampleFormat, userInputSampleFormat, tempInputStreamFlags );

        bp->inputZeroer = PaUtil_SelectZeroer( userInputSampleFormat );
            
        bp->userInputIsInterleaved = (userInputSampleFormat & paNonInterleaved)?0:1;
		
        bp->hostInputIsInterleaved = (hostInputSampleFormat & paNonInterleaved)?0:1;

        bp->userInputSampleFormatIsEqualToHost = ((userInputSampleFormat & ~paNonInterleaved) == (hostInputSampleFormat & ~paNonInterleaved));

        tempInputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserInputSample * inputChannelCount;
         
        bp->tempInputBuffer = PaUtil_AllocateMemory( tempInputBufferSize );
        if( bp->tempInputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }
        
        if( bp->framesInTempInputBuffer > 0 )
            memset( bp->tempInputBuffer, 0, tempInputBufferSize );

        if( userInputSampleFormat & paNonInterleaved )
        {
            bp->tempInputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*inputChannelCount );
            if( bp->tempInputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostInputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor) * inputChannelCount * 2);
        if( bp->hostInputChannels[0] == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostInputChannels[1] = &bp->hostInputChannels[0][inputChannelCount];
    }

    if( outputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bp->outputConverter =
            PaUtil_SelectConverter( userOutputSampleFormat, hostOutputSampleFormat, streamFlags );

        bp->outputZeroer = PaUtil_SelectZeroer( hostOutputSampleFormat );

        bp->userOutputIsInterleaved = (userOutputSampleFormat & paNonInterleaved)?0:1;

        bp->hostOutputIsInterleaved = (hostOutputSampleFormat & paNonInterleaved)?0:1;

        bp->userOutputSampleFormatIsEqualToHost = ((userOutputSampleFormat & ~paNonInterleaved) == (hostOutputSampleFormat & ~paNonInterleaved));

        tempOutputBufferSize =
                bp->framesPerTempBuffer * bp->bytesPerUserOutputSample * outputChannelCount;

        bp->tempOutputBuffer = PaUtil_AllocateMemory( tempOutputBufferSize );
        if( bp->tempOutputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        if( bp->framesInTempOutputBuffer > 0 )
            memset( bp->tempOutputBuffer, 0, tempOutputBufferSize );
        
        if( userOutputSampleFormat & paNonInterleaved )
        {
            bp->tempOutputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*outputChannelCount );
            if( bp->tempOutputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostOutputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor)*outputChannelCount * 2 );
        if( bp->hostOutputChannels[0] == 0 )
        {                                                                     
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostOutputChannels[1] = &bp->hostOutputChannels[0][outputChannelCount];
    }

    PaUtil_InitializeTriangularDitherState( &bp->ditherGenerator );

    bp->samplePeriod = 1. / sampleRate;

    bp->streamCallback = streamCallback;
    bp->userData = userData;

    return result;

error:
    if( bp->tempInputBuffer )
        PaUtil_FreeMemory( bp->tempInputBuffer );

    if( bp->tempInputBufferPtrs )
        PaUtil_FreeMemory( bp->tempInputBufferPtrs );

    if( bp->hostInputChannels[0] )
        PaUtil_FreeMemory( bp->hostInputChannels[0] );

    if( bp->tempOutputBuffer )
        PaUtil_FreeMemory( bp->tempOutputBuffer );

    if( bp->tempOutputBufferPtrs )
        PaUtil_FreeMemory( bp->tempOutputBufferPtrs );

    if( bp->hostOutputChannels[0] )
        PaUtil_FreeMemory( bp->hostOutputChannels[0] );

    return result;
}